

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O1

bool __thiscall
tcu::x11::XlibDisplay::getVisualInfo(XlibDisplay *this,VisualID visualID,XVisualInfo *dst)

{
  long lVar1;
  int numVisuals;
  XVisualInfo query;
  
  lVar1 = XGetVisualInfo(this->m_display,1);
  if (lVar1 != 0) {
    XFree(lVar1);
  }
  return false;
}

Assistant:

bool XlibDisplay::getVisualInfo (VisualID visualID, XVisualInfo& dst)
{
	XVisualInfo		query;
	query.visualid = visualID;
	int				numVisuals	= 0;
	XVisualInfo*	response	= XGetVisualInfo(m_display, VisualIDMask, &query, &numVisuals);
	bool			succ		= false;

	if (response != DE_NULL)
	{
		if (numVisuals > 0) // should be 1, but you never know...
		{
			dst = response[0];
			succ = true;
		}
		XFree(response);
	}

	return succ;
}